

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luajit.c
# Opt level: O2

int pushline(lua_State *L,int firstline)

{
  size_t sVar1;
  char *pcVar2;
  int iVar3;
  char *__s;
  undefined8 uStack_230;
  char buf [512];
  
  pcVar2 = "_PROMPT";
  if (firstline == 0) {
    pcVar2 = "_PROMPT2";
  }
  __s = "> ";
  if (firstline == 0) {
    __s = ">> ";
  }
  uStack_230 = 0x1095e6;
  lua_getfield(L,-0x2712,pcVar2);
  iVar3 = 0;
  uStack_230 = 0x1095f6;
  pcVar2 = lua_tolstring(L,-1,(size_t *)0x0);
  if (pcVar2 != (char *)0x0) {
    __s = pcVar2;
  }
  uStack_230 = 0x109610;
  fputs(__s,_stdout);
  uStack_230 = 0x109619;
  fflush(_stdout);
  uStack_230 = 0x109624;
  lua_settop(L,-2);
  uStack_230 = 0x10963b;
  pcVar2 = fgets(buf,0x200,_stdin);
  if (pcVar2 != (char *)0x0) {
    uStack_230 = 0x10964b;
    sVar1 = strlen(buf);
    if ((sVar1 != 0) && (buf[sVar1 - 1] == '\n')) {
      buf[sVar1 - 1] = '\0';
    }
    if ((firstline == 0) || (buf[0] != '=')) {
      uStack_230 = 0x10968a;
      lua_pushstring(L,buf);
    }
    else {
      uStack_230 = 0x10967d;
      lua_pushfstring(L,"return %s",buf + 1);
    }
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static int pushline(lua_State *L, int firstline)
{
  char buf[LUA_MAXINPUT];
  write_prompt(L, firstline);
  if (fgets(buf, LUA_MAXINPUT, stdin)) {
    size_t len = strlen(buf);
    if (len > 0 && buf[len-1] == '\n')
      buf[len-1] = '\0';
    if (firstline && buf[0] == '=')
      lua_pushfstring(L, "return %s", buf+1);
    else
      lua_pushstring(L, buf);
    return 1;
  }
  return 0;
}